

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O0

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::build(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
        *this)

{
  bool bVar1;
  ObserverBase *in_RDI;
  int id;
  Item it;
  Notifier *nf;
  Item *in_stack_ffffffffffffffb8;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *in_stack_ffffffffffffffc0;
  Arc local_24;
  int local_20;
  Node local_18;
  Node local_14;
  Notifier *local_10;
  
  local_10 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
             ::ObserverBase::notifier(in_RDI);
  allocate_memory((ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
                   *)in_stack_ffffffffffffffc0);
  SmartDigraphBase::Node::Node(&local_14);
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::first(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  while( true ) {
    SmartDigraphBase::Node::Node(&local_18);
    bVar1 = SmartDigraphBase::Node::operator!=(&local_14,local_18);
    if (!bVar1) break;
    local_20 = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
               ::id(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 =
         (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
          *)&in_RDI[1]._index;
    SmartDigraphBase::Arc::Arc(&local_24);
    std::allocator_traits<std::allocator<lemon::SmartDigraphBase::Arc>>::
    construct<lemon::SmartDigraphBase::Arc,lemon::SmartDigraphBase::Arc>
              ((allocator_type *)in_stack_ffffffffffffffc0,(Arc *)in_stack_ffffffffffffffb8,
               (Arc *)0x2c6847);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
    ::next(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

virtual void build() {
    Notifier* nf = Parent::notifier();
    allocate_memory();
    Item it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }